

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cpp
# Opt level: O3

void HandleTargetOutcome(bool success)

{
  undefined4 uVar1;
  void *in_RAX;
  OmptInterface *this;
  void **in_RCX;
  void **args_base;
  int32_t in_ESI;
  undefined7 in_register_00000039;
  int64_t device_id;
  int64_t *in_R8;
  int64_t *in_R9;
  int unaff_retaddr;
  int in_stack_00000010;
  
  device_id = CONCAT71(in_register_00000039,success);
  if (TargetOffloadPolicy != tgt_disabled) {
    if (TargetOffloadPolicy != tgt_mandatory) {
      if (TargetOffloadPolicy != tgt_default) {
        return;
      }
      HandleTargetOutcome();
    }
    if ((char)device_id != '\0') {
      return;
    }
    HandleTargetOutcome();
  }
  if ((char)device_id == '\0') {
    return;
  }
  HandleTargetOutcome();
  if (in_stack_00000010 + unaff_retaddr != 0 &&
      SCARRY4(in_stack_00000010,unaff_retaddr) == in_stack_00000010 + unaff_retaddr < 0) {
    uVar1 = __kmpc_global_thread_num(0);
    __kmpc_omp_taskwait(0,uVar1);
  }
  ompt_interface::__tls_init();
  this = (OmptInterface *)__tls_get_addr(&PTR_0010ffa8);
  OmptInterface::ompt_state_set(this,&stack0xfffffffffffffff0,in_RAX);
  __tgt_target_data_begin(device_id,in_ESI,args_base,in_RCX,in_R8,in_R9);
  ompt_interface::__tls_init();
  OmptInterface::ompt_state_clear(this);
  return;
}

Assistant:

static void HandleTargetOutcome(bool success) {
  switch (TargetOffloadPolicy) {
    case tgt_disabled:
      if (success) {
        FATAL_MESSAGE0(1, "expected no offloading while offloading is disabled");
      }
      break;
    case tgt_default:
      FATAL_MESSAGE0(1, "default offloading policy must be switched to "
                        "mandatory or disabled");
      break;
    case tgt_mandatory:
      if (!success) {
        FATAL_MESSAGE0(1, "failure of target construct while offloading is mandatory");
      }
      break;
  }
}